

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int planxythetamlevlat(PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,
                      bool forwardSearch)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  anaPlanner *this;
  ostream *poVar6;
  FILE *__stream;
  reference pvVar7;
  SBPL_Exception *pSVar8;
  char *__s;
  uint uVar9;
  ulong __n;
  allocator<char> local_469;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  value_type local_448;
  int local_438;
  uchar cost_possibly_circumscribed_thresh_addlevels [2];
  uchar cost_inscribed_thresh_addlevels [2];
  MDPConfig MDPCfg;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsVV [2];
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  EnvironmentNAVXYTHETAMLEVLAT environment_navxythetalat;
  
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.x = -0.02;
  local_448.y = -0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_448);
  local_448.x = 0.02;
  local_448.y = -0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_448);
  local_448.x = 0.02;
  local_448.y = 0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_448);
  local_448.x = -0.02;
  local_448.y = 0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_448);
  EnvironmentNAVXYTHETAMLEVLAT::EnvironmentNAVXYTHETAMLEVLAT(&environment_navxythetalat);
  cVar3 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((char *)&environment_navxythetalat,(vector *)envCfgFilename,
                     (char *)&perimeterptsV);
  if (cVar3 == '\0') {
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: InitializeEnv failed");
    __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  perimeterptsVV[1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  perimeterptsVV[1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsVV[0].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsVV[1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsVV[0].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsVV[0].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.x = -0.02;
  local_448.y = -0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(perimeterptsVV,&local_448);
  local_448.x = 0.02;
  local_448.y = -0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(perimeterptsVV,&local_448);
  local_448.x = 0.02;
  local_448.y = 0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(perimeterptsVV,&local_448);
  local_448.x = -0.02;
  local_448.y = 0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(perimeterptsVV,&local_448);
  printf("Number of additional levels = %d\n",1);
  cost_inscribed_thresh_addlevels[0] = 0xff;
  cost_inscribed_thresh_addlevels[1] = 0xff;
  cost_possibly_circumscribed_thresh_addlevels[0] = '\0';
  cost_possibly_circumscribed_thresh_addlevels[1] = '\0';
  cVar3 = EnvironmentNAVXYTHETAMLEVLAT::InitializeAdditionalLevels
                    ((int)&environment_navxythetalat,(vector *)0x1,(uchar *)perimeterptsVV,
                     cost_inscribed_thresh_addlevels);
  if (cVar3 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xythetaPath,
               "ERROR: InitializeAdditionalLevels failed with numofaddlevels=",&local_469);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&solution_stateIDs_V,(string *)&xythetaPath,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&xythetaPath);
    std::ostream::operator<<
              ((ostream *)
               &solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,1);
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    SBPL_Exception::SBPL_Exception(pSVar8,(string *)&xythetaPath);
    __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
  cVar3 = EnvironmentNAVXYTHETAMLEVLAT::Set2DMapforAddLev
                    ((uchar **)&environment_navxythetalat,(int)*(undefined8 *)(lVar5 + 0x28));
  if (cVar3 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xythetaPath,
               "ERROR: Setting Map for the Additional Level failed with level ",&local_469);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&solution_stateIDs_V,(string *)&xythetaPath,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&xythetaPath);
    std::ostream::operator<<
              ((ostream *)
               &solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0);
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    SBPL_Exception::SBPL_Exception(pSVar8,(string *)&xythetaPath);
    __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar3 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)&environment_navxythetalat);
  if (cVar3 == '\0') {
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: InitializeMDPCfg failed");
    __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  switch(plannerType) {
  case PLANNER_TYPE_ADSTAR:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               forwardSearch);
    break;
  case PLANNER_TYPE_ARASTAR:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner
              ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               forwardSearch);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case PLANNER_TYPE_RSTAR:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar4 = 0;
    goto LAB_00107e0b;
  case PLANNER_TYPE_ANASTAR:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner
              (this,(DiscreteSpaceInformation *)&environment_navxythetalat,forwardSearch);
  }
  iVar4 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
  if (iVar4 == 0) {
    puts("ERROR: failed to set start state");
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: failed to set start state");
  }
  else {
    iVar4 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
    if (iVar4 != 0) {
      (**(code **)(*(long *)this + 0x90))(0,this);
      (**(code **)(*(long *)this + 0x40))(this,0);
      puts("start planning...");
      local_438 = (*(code *)**(undefined8 **)this)(0,this,&solution_stateIDs_V);
      puts("done planning");
      poVar6 = std::operator<<((ostream *)&std::cout,"size of solution=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
      __stream = fopen("sol.txt","w");
      if (__stream == (FILE *)0x0) {
        puts("ERROR: could not open solution file");
        pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: could not open solution file");
        __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                ((vector *)&environment_navxythetalat,(vector *)&solution_stateIDs_V);
      printf("solution size=%d\n",
             ((long)xythetaPath.
                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)xythetaPath.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff,
             ((long)xythetaPath.
                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)xythetaPath.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) % 0x18);
      for (uVar9 = 0; __n = (ulong)uVar9,
          __n < (ulong)(((long)xythetaPath.
                               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)xythetaPath.
                              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar9 = uVar9 + 1)
      {
        pvVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                           (&xythetaPath,__n);
        uVar1 = *(undefined8 *)pvVar7;
        pvVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                           (&xythetaPath,__n);
        uVar2 = *(undefined8 *)(pvVar7 + 8);
        pvVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                           (&xythetaPath,__n);
        fprintf(__stream,"%.3f %.3f %.3f\n",(int)uVar1,uVar2,*(undefined8 *)(pvVar7 + 0x10));
      }
      fclose(__stream);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
      iVar4 = local_438;
      __s = "Solution is found";
      if (local_438 == 0) {
        __s = "Solution does not exist";
      }
      puts(__s);
      fflush((FILE *)0x0);
      (**(code **)(*(long *)this + 0xa0))(this);
      std::_Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~_Vector_base
                (&xythetaPath.
                  super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>);
LAB_00107e0b:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>);
      lVar5 = 0x18;
      do {
        std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base
                  ((_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)
                   ((long)&perimeterptsVV[0].
                           super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT(&environment_navxythetalat);
      std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base
                (&perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>);
      return iVar4;
    }
    puts("ERROR: failed to set goal state");
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: failed to set goal state");
  }
  __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planxythetamlevlat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    int bRet = 0;

    double allocated_time_secs = 10.0; //in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    //set the perimeter of the robot (it is given with 0,0,0 robot ref. point for which planning is done)
    //this is for the default level - base level
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.02; //0.3;
    double halflength = 0.02; //0.45;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentNAVXYTHETAMLEVLAT environment_navxythetalat;

    if (!environment_navxythetalat.InitializeEnv(envCfgFilename, perimeterptsV, motPrimFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //this is for the second level - upper body level
    vector<sbpl_2Dpt_t> perimeterptsVV[2];
    perimeterptsVV[0].clear();
    halfwidth = 0.02;
    halflength = 0.02;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsVV[0].push_back(pt_m);

    //	perimeterptsV.clear();
    //	perimeterptsVV[0].clear();

    //enable the second level
    int numofaddlevels = 1;
    printf("Number of additional levels = %d\n", numofaddlevels);
    unsigned char cost_inscribed_thresh_addlevels[2]; //size should be at least numofaddlevels
    unsigned char cost_possibly_circumscribed_thresh_addlevels[2]; //size should be at least numofaddlevels
    //no costs are indicative of whether a cell is within inner circle
    cost_inscribed_thresh_addlevels[0] = 255;
    //no costs are indicative of whether a cell is within outer circle
    cost_possibly_circumscribed_thresh_addlevels[0] = 0;
    //no costs are indicative of whether a cell is within inner circle
    cost_inscribed_thresh_addlevels[1] = 255;
    //no costs are indicative of whether a cell is within outer circle
    cost_possibly_circumscribed_thresh_addlevels[1] = 0;
    if (!environment_navxythetalat.InitializeAdditionalLevels(numofaddlevels, perimeterptsVV,
                                                              cost_inscribed_thresh_addlevels,
                                                              cost_possibly_circumscribed_thresh_addlevels))
    {
        std::stringstream ss("ERROR: InitializeAdditionalLevels failed with numofaddlevels=");
        ss << numofaddlevels;
        throw SBPL_Exception(ss.str());
    }

    //set the map for the second level (index parameter for the additional levels and is zero based)
    //for this example, we pass in the same map as the map for the base. In general, it can be a totally different map
    //as it corresponds to a different level
    //NOTE: this map has to have costs set correctly with respect to inner and outer radii of the robot
    //if the second level of the robot has these radii different than at the base level, then costs
    //should reflect this
    //(see explanation for cost_possibly_circumscribed_thresh and
    //cost_inscribed_thresh parameters in environment_navxythetalat.h file)
    int addlevind = 0;
    if (!environment_navxythetalat.Set2DMapforAddLev(
            (const unsigned char**)(environment_navxythetalat.GetEnvNavConfig()->Grid2D), addlevind))
    {
        std::stringstream ss("ERROR: Setting Map for the Additional Level failed with level ");
        ss << addlevind;
        throw SBPL_Exception(ss.str());
    }

    // Initialize MDP Info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);

    //set search mode
    planner->set_search_mode(bsearchuntilfirstsolution);

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    environment_navxythetalat.PrintTimeStat(stdout);

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        printf("ERROR: could not open solution file\n");
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    vector<sbpl_xy_theta_pt_t> xythetaPath;
    environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
    printf("solution size=%d\n", (unsigned int)xythetaPath.size());
    for (unsigned int i = 0; i < xythetaPath.size(); i++) {
        fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
    }
    fclose(fSol);

    environment_navxythetalat.PrintTimeStat(stdout);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}